

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::StateToWorkq(DFA *this,State *s,Workq *q)

{
  long *in_RSI;
  int i;
  uint32_t in_stack_000001b0;
  int in_stack_000001b4;
  Workq *in_stack_000001b8;
  DFA *in_stack_000001c0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  Workq::clear((Workq *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = 0;
  do {
    if ((int)in_RSI[1] <= iVar1) {
      return;
    }
    if (*(int *)(*in_RSI + (long)iVar1 * 4) == -1) {
      Workq::mark((Workq *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
    }
    else {
      if (*(int *)(*in_RSI + (long)iVar1 * 4) == -2) {
        return;
      }
      AddToQueue(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void DFA::StateToWorkq(State* s, Workq* q) {
  q->clear();
  for (int i = 0; i < s->ninst_; i++) {
    if (s->inst_[i] == Mark) {
      q->mark();
    } else if (s->inst_[i] == MatchSep) {
      // Nothing after this is an instruction!
      break;
    } else {
      // Explore from the head of the list.
      AddToQueue(q, s->inst_[i], s->flag_ & kFlagEmptyMask);
    }
  }
}